

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

char * __thiscall
CoreML::Specification::Convolution3DLayerParams::_InternalParse
          (Convolution3DLayerParams *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  ParseContext *this_00;
  bool bVar1;
  uint32_t uVar2;
  WeightParams *pWVar3;
  RepeatedField<unsigned_long> *object;
  uint64_t uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  uint64_t val;
  ParseContext *pPStack_20;
  uint32_t tag;
  ParseContext *ctx_local;
  char *ptr_local;
  Convolution3DLayerParams *this_local;
  
  pPStack_20 = ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)this;
LAB_003014fc:
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(pPStack_20,(char **)&ctx_local);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return (char *)ctx_local;
    }
    ctx_local = (ParseContext *)
                google::protobuf::internal::ReadTag
                          ((char *)ctx_local,(uint32_t *)((long)&val + 4),0);
    this_00 = pPStack_20;
    tag_00 = val._4_4_;
    switch(val._4_4_ >> 3) {
    case 1:
      if ((val._4_4_ & 0xff) != 8) goto LAB_00301bd1;
      uVar2 = google::protobuf::internal::ReadVarint32((char **)&ctx_local);
      this->outputchannels_ = uVar2;
      break;
    case 2:
      if ((val._4_4_ & 0xff) != 0x10) goto LAB_00301bd1;
      uVar2 = google::protobuf::internal::ReadVarint32((char **)&ctx_local);
      this->inputchannels_ = uVar2;
      break;
    default:
      goto LAB_00301bd1;
    case 10:
      if ((val._4_4_ & 0xff) != 0x50) goto LAB_00301bd1;
      uVar2 = google::protobuf::internal::ReadVarint32((char **)&ctx_local);
      this->ngroups_ = uVar2;
      break;
    case 0x14:
      if ((val._4_4_ & 0xff) != 0xa0) goto LAB_00301bd1;
      uVar2 = google::protobuf::internal::ReadVarint32((char **)&ctx_local);
      this->kerneldepth_ = uVar2;
      break;
    case 0x15:
      if ((val._4_4_ & 0xff) != 0xa8) goto LAB_00301bd1;
      uVar2 = google::protobuf::internal::ReadVarint32((char **)&ctx_local);
      this->kernelheight_ = uVar2;
      break;
    case 0x16:
      if ((val._4_4_ & 0xff) != 0xb0) goto LAB_00301bd1;
      uVar2 = google::protobuf::internal::ReadVarint32((char **)&ctx_local);
      this->kernelwidth_ = uVar2;
      break;
    case 0x1f:
      if ((val._4_4_ & 0xff) != 0xf8) goto LAB_00301bd1;
      uVar2 = google::protobuf::internal::ReadVarint32((char **)&ctx_local);
      this->stridedepth_ = uVar2;
      break;
    case 0x20:
      if ((val._4_4_ & 0xff) != 0) goto LAB_00301bd1;
      uVar2 = google::protobuf::internal::ReadVarint32((char **)&ctx_local);
      this->strideheight_ = uVar2;
      break;
    case 0x21:
      if ((val._4_4_ & 0xff) != 8) goto LAB_00301bd1;
      uVar2 = google::protobuf::internal::ReadVarint32((char **)&ctx_local);
      this->stridewidth_ = uVar2;
      break;
    case 0x28:
      if ((val._4_4_ & 0xff) != 0x40) goto LAB_00301bd1;
      uVar2 = google::protobuf::internal::ReadVarint32((char **)&ctx_local);
      this->dilationdepth_ = uVar2;
      break;
    case 0x29:
      if ((val._4_4_ & 0xff) != 0x48) goto LAB_00301bd1;
      uVar2 = google::protobuf::internal::ReadVarint32((char **)&ctx_local);
      this->dilationheight_ = uVar2;
      break;
    case 0x2a:
      if ((val._4_4_ & 0xff) != 0x50) goto LAB_00301bd1;
      uVar2 = google::protobuf::internal::ReadVarint32((char **)&ctx_local);
      this->dilationwidth_ = uVar2;
      break;
    case 0x32:
      if ((val._4_4_ & 0xff) != 0x90) goto LAB_00301bd1;
      uVar4 = google::protobuf::internal::ReadVarint64((char **)&ctx_local);
      this->hasbias_ = uVar4 != 0;
      break;
    case 0x3c:
      if ((val._4_4_ & 0xff) != 0xe2) goto LAB_00301bd1;
      pWVar3 = _internal_mutable_weights(this);
      ctx_local = (ParseContext *)
                  google::protobuf::internal::ParseContext::ParseMessage
                            (this_00,&pWVar3->super_MessageLite,(char *)ctx_local);
      break;
    case 0x3d:
      if ((val._4_4_ & 0xff) != 0xea) goto LAB_00301bd1;
      pWVar3 = _internal_mutable_bias(this);
      ctx_local = (ParseContext *)
                  google::protobuf::internal::ParseContext::ParseMessage
                            (this_00,&pWVar3->super_MessageLite,(char *)ctx_local);
      break;
    case 0x46:
      if ((val._4_4_ & 0xff) == 0x30) {
        uVar4 = google::protobuf::internal::ReadVarint64((char **)&ctx_local);
        if (ctx_local == (ParseContext *)0x0) {
          return (char *)(ParseContext *)0x0;
        }
        _internal_set_paddingtype(this,(Convolution3DLayerParams_PaddingType)uVar4);
        goto LAB_003014fc;
      }
LAB_00301bd1:
      if ((val._4_4_ == 0) || ((val._4_4_ & 7) == 4)) {
        if (ctx_local == (ParseContext *)0x0) {
          return (char *)(ParseContext *)0x0;
        }
        google::protobuf::internal::EpsCopyInputStream::SetLastTag
                  (&pPStack_20->super_EpsCopyInputStream,val._4_4_);
        return (char *)ctx_local;
      }
      unknown = google::protobuf::internal::InternalMetadata::
                mutable_unknown_fields<std::__cxx11::string>
                          (&(this->super_MessageLite)._internal_metadata_);
      ctx_local = (ParseContext *)
                  google::protobuf::internal::UnknownFieldParse
                            (tag_00,unknown,(char *)ctx_local,pPStack_20);
      break;
    case 0x50:
      if ((val._4_4_ & 0xff) != 0x80) goto LAB_00301bd1;
      uVar2 = google::protobuf::internal::ReadVarint32((char **)&ctx_local);
      this->custompaddingfront_ = uVar2;
      break;
    case 0x51:
      if ((val._4_4_ & 0xff) != 0x88) goto LAB_00301bd1;
      uVar2 = google::protobuf::internal::ReadVarint32((char **)&ctx_local);
      this->custompaddingback_ = uVar2;
      break;
    case 0x52:
      if ((val._4_4_ & 0xff) != 0x90) goto LAB_00301bd1;
      uVar2 = google::protobuf::internal::ReadVarint32((char **)&ctx_local);
      this->custompaddingtop_ = uVar2;
      break;
    case 0x53:
      if ((val._4_4_ & 0xff) != 0x98) goto LAB_00301bd1;
      uVar2 = google::protobuf::internal::ReadVarint32((char **)&ctx_local);
      this->custompaddingbottom_ = uVar2;
      break;
    case 0x54:
      if ((val._4_4_ & 0xff) != 0xa0) goto LAB_00301bd1;
      uVar2 = google::protobuf::internal::ReadVarint32((char **)&ctx_local);
      this->custompaddingleft_ = uVar2;
      break;
    case 0x55:
      if ((val._4_4_ & 0xff) != 0xa8) goto LAB_00301bd1;
      uVar2 = google::protobuf::internal::ReadVarint32((char **)&ctx_local);
      this->custompaddingright_ = uVar2;
      break;
    case 0x56:
      if ((val._4_4_ & 0xff) != 0xb0) goto LAB_00301bd1;
      uVar4 = google::protobuf::internal::ReadVarint64((char **)&ctx_local);
      this->isdeconvolution_ = uVar4 != 0;
      break;
    case 0x57:
      if ((val._4_4_ & 0xff) == 0xba) {
        object = _internal_mutable_outputshape(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::PackedUInt64Parser
                              (object,(char *)ctx_local,pPStack_20);
      }
      else {
        if ((val._4_4_ & 0xff) != 0xb8) goto LAB_00301bd1;
        uVar4 = google::protobuf::internal::ReadVarint64((char **)&ctx_local);
        _internal_add_outputshape(this,uVar4);
      }
    }
    if (ctx_local == (ParseContext *)0x0) {
      return (char *)(ParseContext *)0x0;
    }
  } while( true );
}

Assistant:

const char* Convolution3DLayerParams::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // int32 outputChannels = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          outputchannels_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 inputChannels = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 16)) {
          inputchannels_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 nGroups = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 80)) {
          ngroups_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 kernelDepth = 20;
      case 20:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 160)) {
          kerneldepth_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 kernelHeight = 21;
      case 21:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 168)) {
          kernelheight_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 kernelWidth = 22;
      case 22:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 176)) {
          kernelwidth_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 strideDepth = 31;
      case 31:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 248)) {
          stridedepth_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 strideHeight = 32;
      case 32:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 0)) {
          strideheight_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 strideWidth = 33;
      case 33:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          stridewidth_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 dilationDepth = 40;
      case 40:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 64)) {
          dilationdepth_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 dilationHeight = 41;
      case 41:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 72)) {
          dilationheight_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 dilationWidth = 42;
      case 42:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 80)) {
          dilationwidth_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // bool hasBias = 50;
      case 50:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 144)) {
          hasbias_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.WeightParams weights = 60;
      case 60:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 226)) {
          ptr = ctx->ParseMessage(_internal_mutable_weights(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.WeightParams bias = 61;
      case 61:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 234)) {
          ptr = ctx->ParseMessage(_internal_mutable_bias(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.Convolution3DLayerParams.PaddingType paddingType = 70;
      case 70:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 48)) {
          uint64_t val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_paddingtype(static_cast<::CoreML::Specification::Convolution3DLayerParams_PaddingType>(val));
        } else
          goto handle_unusual;
        continue;
      // int32 customPaddingFront = 80;
      case 80:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 128)) {
          custompaddingfront_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 customPaddingBack = 81;
      case 81:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 136)) {
          custompaddingback_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 customPaddingTop = 82;
      case 82:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 144)) {
          custompaddingtop_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 customPaddingBottom = 83;
      case 83:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 152)) {
          custompaddingbottom_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 customPaddingLeft = 84;
      case 84:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 160)) {
          custompaddingleft_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 customPaddingRight = 85;
      case 85:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 168)) {
          custompaddingright_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // bool isDeconvolution = 86;
      case 86:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 176)) {
          isdeconvolution_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // repeated uint64 outputShape = 87;
      case 87:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 186)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedUInt64Parser(_internal_mutable_outputshape(), ptr, ctx);
          CHK_(ptr);
        } else if (static_cast<uint8_t>(tag) == 184) {
          _internal_add_outputshape(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}